

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Dict * tagsLookup(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr s)

{
  uint uVar1;
  int iVar2;
  Dict *pDVar3;
  bool bVar4;
  DictHash *local_38;
  DictHash *p;
  Dict *np;
  ctmbstr s_local;
  TidyTagImpl *tags_local;
  TidyDocImpl *doc_local;
  
  if (s == (ctmbstr)0x0) {
    return (Dict *)0x0;
  }
  uVar1 = tagsHash(s);
  local_38 = tags->hashtab[uVar1];
  while( true ) {
    bVar4 = false;
    if (local_38 != (DictHash *)0x0) {
      bVar4 = local_38->tag != (Dict *)0x0;
    }
    if (!bVar4) break;
    iVar2 = prvTidytmbstrcmp(s,local_38->tag->name);
    if (iVar2 == 0) {
      return local_38->tag;
    }
    local_38 = local_38->next;
  }
  p = (DictHash *)(tag_defs + 1);
  while( true ) {
    if ((DictHash *)((long)&tag_defs[0x98].next + 7) < p) {
      p = (DictHash *)tags->declared_tag_list;
      while( true ) {
        if (p == (DictHash *)0x0) {
          return (Dict *)0x0;
        }
        iVar2 = prvTidytmbstrcmp(s,(ctmbstr)p->next);
        if (iVar2 == 0) break;
        p = p[3].next;
      }
      pDVar3 = tagsInstall(doc,tags,(Dict *)p);
      return pDVar3;
    }
    iVar2 = prvTidytmbstrcmp(s,(ctmbstr)p->next);
    if (iVar2 == 0) break;
    p = p + 4;
  }
  pDVar3 = tagsInstall(doc,tags,(Dict *)p);
  return pDVar3;
}

Assistant:

static const Dict* tagsLookup( TidyDocImpl* doc, TidyTagImpl* tags, ctmbstr s )
{
    const Dict *np;
    const DictHash* p;

    if (!s)
        return NULL;

    /* this breaks if declared elements get changed between two   */
    /* parser runs since Tidy would use the cached version rather */
    /* than the new one.                                          */
    /* However, as FreeDeclaredTags() correctly cleans the hash   */
    /* this should not be true anymore.                           */
    for (p = tags->hashtab[tagsHash(s)]; p && p->tag; p = p->next)
        if (TY_(tmbstrcmp)(s, p->tag->name) == 0)
            return p->tag;

    for (np = tag_defs + 1; np < tag_defs + N_TIDY_TAGS; ++np)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    for (np = tags->declared_tag_list; np; np = np->next)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    return NULL;
}